

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O0

void __thiscall
Assimp::COBImporter::ReadFloat3Tuple_Ascii<aiColor3D>(COBImporter *this,aiColor3D *fill,char **in)

{
  ai_real *paVar1;
  ai_real aVar2;
  uint local_2c;
  char *pcStack_28;
  uint i;
  char *rgb;
  char **in_local;
  aiColor3D *fill_local;
  COBImporter *this_local;
  
  pcStack_28 = *in;
  rgb = (char *)in;
  in_local = (char **)fill;
  fill_local = (aiColor3D *)this;
  for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
    SkipSpaces<char>(&stack0xffffffffffffffd8);
    if (*pcStack_28 == ',') {
      pcStack_28 = pcStack_28 + 1;
    }
    SkipSpaces<char>(&stack0xffffffffffffffd8);
    aVar2 = fast_atof(&stack0xffffffffffffffd8);
    paVar1 = aiColor3D::operator[]((aiColor3D *)in_local,local_2c);
    *paVar1 = aVar2;
  }
  *(char **)rgb = pcStack_28;
  return;
}

Assistant:

void COBImporter::ReadFloat3Tuple_Ascii(T& fill, const char** in)
{
    const char* rgb = *in;
    for(unsigned int i = 0; i < 3; ++i) {
        SkipSpaces(&rgb);
        if (*rgb == ',')++rgb;
        SkipSpaces(&rgb);

        fill[i] = fast_atof(&rgb);
    }
    *in = rgb;
}